

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

void crnd::crnd_assert(char *pExp,char *pFile,uint line)

{
  char buf [512];
  char acStack_208 [512];
  
  snprintf(acStack_208,0x200,"%s(%u): Assertion failure: \"%s\"\n",pFile,(ulong)line,pExp);
  puts(acStack_208);
  return;
}

Assistant:

void crnd_assert(const char* pExp, const char* pFile, unsigned line) {
  char buf[512];

#if defined(_WIN32)
  sprintf_s(buf, sizeof(buf), "%s(%u): Assertion failure: \"%s\"\n", pFile, line, pExp);
#else
  snprintf(buf, sizeof(buf), "%s(%u): Assertion failure: \"%s\"\n", pFile, line, pExp);
#endif

  crnd_output_debug_string(buf);

  puts(buf);

  if (crnd_is_debugger_present())
    crnd_debug_break();
}